

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O0

void __thiscall Hpipe::Cond::Range::write_cpp(Range *this,ostream *os,string *var,bool in_or)

{
  int r;
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  reference piVar4;
  char *pcVar5;
  bool bVar6;
  const_iterator cStack_40;
  int v;
  const_iterator __end1;
  const_iterator __begin1;
  Vec<int> *__range1;
  int cpt;
  bool par;
  bool in_or_local;
  string *var_local;
  ostream *os_local;
  Range *this_local;
  
  bVar6 = false;
  if (((in_or) && (bVar6 = false, this->beg != this->end)) &&
     ((this->beg == 0 || (bVar6 = true, 0xfe < this->end)))) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      (&(this->exceptions).super_vector<int,_std::allocator<int>_>);
    bVar6 = sVar2 != 0;
  }
  if (bVar6) {
    std::operator<<(os,"( ");
  }
  __range1._0_4_ = 1;
  if (this->beg == this->end) {
    poVar3 = std::operator<<(os,(string *)var);
    poVar3 = std::operator<<(poVar3," == ");
    cc(poVar3,this->beg);
  }
  else if ((this->beg == 0) || (0xfe < this->end)) {
    if (this->end < 0xff) {
      poVar3 = std::operator<<(os,(string *)var);
      poVar3 = std::operator<<(poVar3," <= ");
      cc(poVar3,this->end);
    }
    else if (this->beg == 0) {
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        (&(this->exceptions).super_vector<int,_std::allocator<int>_>);
      if (bVar1) {
        std::operator<<(os,"true");
      }
      __range1._0_4_ = (uint)bVar1;
    }
    else {
      poVar3 = std::operator<<(os,(string *)var);
      poVar3 = std::operator<<(poVar3," >= ");
      cc(poVar3,this->beg);
    }
  }
  else {
    poVar3 = std::operator<<(os,(string *)var);
    poVar3 = std::operator<<(poVar3," >= ");
    poVar3 = cc(poVar3,this->beg);
    poVar3 = std::operator<<(poVar3," and ");
    poVar3 = std::operator<<(poVar3,(string *)var);
    poVar3 = std::operator<<(poVar3," <= ");
    cc(poVar3,this->end);
  }
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     (&(this->exceptions).super_vector<int,_std::allocator<int>_>);
  cStack_40 = std::vector<int,_std::allocator<int>_>::end
                        (&(this->exceptions).super_vector<int,_std::allocator<int>_>);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc0), bVar1) {
    piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1);
    r = *piVar4;
    pcVar5 = "";
    if ((uint)__range1 != 0) {
      pcVar5 = " and ";
    }
    poVar3 = std::operator<<(os,pcVar5);
    poVar3 = std::operator<<(poVar3,(string *)var);
    poVar3 = std::operator<<(poVar3," != ");
    cc(poVar3,r);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
    __range1._0_4_ = (uint)__range1 + 1;
  }
  if (bVar6) {
    std::operator<<(os," )");
  }
  return;
}

Assistant:

void Cond::Range::write_cpp( std::ostream &os, const std::string &var, bool in_or ) const {
    bool par = in_or and beg != end and ( ( beg and end < 255 ) or exceptions.size() );
    if ( par )
        os << "( ";

    int cpt = 1;
    if ( beg == end )
        cc( os << var << " == ", beg );
    else if ( beg and end < 255 )
        cc( cc( os <<  var << " >= ", beg ) << " and " << var << " <= ", end );
    else if ( end < 255 )
        cc( os << var << " <= ", end );
    else if ( beg )
        cc( os << var << " >= ", beg );
    else if ( exceptions.empty() )
        os << "true";
    else
        cpt = 0;

    for( int v : exceptions )
        cc( os << ( cpt++ ? " and " : "" ) << var << " != ", v );

    if ( par )
        os << " )";
}